

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::date_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool,true,false>
               (string_t *ldata,date_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  timestamp_t tVar3;
  ulong uVar4;
  timestamp_t *ptVar5;
  timestamp_t *ptVar6;
  idx_t iVar7;
  idx_t i;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  ulong uVar11;
  string_t specifier;
  string_t specifier_00;
  string_t specifier_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    iVar7 = count;
    for (iVar9 = 0; count != iVar9; iVar9 = iVar9 + 1) {
      specifier_01.value._8_4_ = rdata[iVar9].days;
      specifier_01.value._0_8_ = (ldata->value).pointer.ptr;
      specifier_01.value._12_4_ = 0;
      tVar3 = DateTruncBinaryOperator::
              Operation<duckdb::string_t,duckdb::date_t,duckdb::timestamp_t>
                        (*(DateTruncBinaryOperator **)&ldata->value,specifier_01,
                         (date_t)(int32_t)iVar7);
      result_data[iVar9].value = tVar3.value;
    }
  }
  else {
    uVar10 = 0;
    for (ptVar5 = (timestamp_t *)0x0; ptVar5 != (timestamp_t *)(count + 0x3f >> 6);
        ptVar5 = (timestamp_t *)((long)&ptVar5->value + 1)) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      ptVar6 = ptVar5;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar8 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar8 = count;
        }
LAB_01dd1cdf:
        for (; uVar4 = uVar10, uVar10 < uVar8; uVar10 = uVar10 + 1) {
          specifier.value._8_4_ = rdata[uVar10].days;
          specifier.value._0_8_ = (ldata->value).pointer.ptr;
          specifier.value._12_4_ = 0;
          tVar3 = DateTruncBinaryOperator::
                  Operation<duckdb::string_t,duckdb::date_t,duckdb::timestamp_t>
                            (*(DateTruncBinaryOperator **)&ldata->value,specifier,
                             (date_t)(int32_t)ptVar6);
          result_data[uVar10].value = tVar3.value;
        }
      }
      else {
        uVar2 = puVar1[(long)ptVar5];
        uVar8 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar8 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_01dd1cdf;
        uVar4 = uVar8;
        if (uVar2 != 0) {
          for (uVar11 = 0; uVar4 = uVar11 + uVar10, uVar11 + uVar10 < uVar8; uVar11 = uVar11 + 1) {
            if ((uVar2 >> (uVar11 & 0x3f) & 1) != 0) {
              specifier_00.value._8_4_ = rdata[uVar10 + uVar11].days;
              specifier_00.value._0_8_ = (ldata->value).pointer.ptr;
              specifier_00.value._12_4_ = 0;
              tVar3 = DateTruncBinaryOperator::
                      Operation<duckdb::string_t,duckdb::date_t,duckdb::timestamp_t>
                                (*(DateTruncBinaryOperator **)&ldata->value,specifier_00,
                                 (date_t)(int32_t)ptVar6);
              (result_data + uVar10)[uVar11].value = tVar3.value;
              ptVar6 = result_data + uVar10;
            }
          }
        }
      }
      uVar10 = uVar4;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}